

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# srtStreamReader.cpp
# Opt level: O3

uint8_t * __thiscall SRTStreamReader::renderNextMessage(SRTStreamReader *this,uint32_t *renderedLen)

{
  queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  char cVar1;
  size_type sVar2;
  bool bVar3;
  string *psVar4;
  uint8_t *puVar5;
  ostream *poVar6;
  undefined4 *puVar7;
  ParseState PVar8;
  size_type sVar9;
  string *text;
  ostringstream ss;
  uint *local_1c0;
  undefined8 local_1b8;
  uint local_1b0;
  undefined4 uStack_1ac;
  undefined4 uStack_1a8;
  undefined4 uStack_1a4;
  ostringstream local_1a0 [376];
  
  text = (this->m_sourceText).c.
         super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Deque_impl_data._M_start._M_cur;
  psVar4 = (this->m_sourceText).c.
           super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (psVar4 == text) {
    return (uint8_t *)0x0;
  }
  this_00 = &this->m_sourceText;
  PVar8 = this->m_state;
  if (PVar8 == PARSE_FIRST_LINE) {
    while (sVar2 = text->_M_string_length, sVar2 == 0) {
      std::
      deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::pop_front(&this_00->c);
      this->m_processedSize =
           this->m_processedSize +
           *(this->m_origSize).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
            super__Deque_impl_data._M_start._M_cur;
      std::deque<int,_std::allocator<int>_>::pop_front(&(this->m_origSize).c);
      text = (this->m_sourceText).c.
             super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur;
      if ((this->m_sourceText).c.
          super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_cur == text) {
        return (uint8_t *)0x0;
      }
    }
    this->m_state = PARSE_TIME;
    sVar9 = 0;
    do {
      cVar1 = (text->_M_dataplus)._M_p[sVar9];
      if (cVar1 != ' ' && 9 < (byte)(cVar1 - 0x30U)) goto LAB_001ce153;
      sVar9 = sVar9 + 1;
    } while (sVar2 != sVar9);
    std::
    deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::pop_front(&this_00->c);
    this->m_processedSize =
         this->m_processedSize +
         *(this->m_origSize).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
          super__Deque_impl_data._M_start._M_cur;
    std::deque<int,_std::allocator<int>_>::pop_front(&(this->m_origSize).c);
    text = (this->m_sourceText).c.
           super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur;
    psVar4 = (this->m_sourceText).c.
             super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (psVar4 == text) {
      return (uint8_t *)0x0;
    }
    PVar8 = this->m_state;
  }
  if (PVar8 == PARSE_TIME) {
LAB_001ce153:
    bVar3 = parseTime(this,text);
    if (!bVar3) {
      std::__cxx11::ostringstream::ostringstream(local_1a0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a0,"Invalid SRT format. \"",0x15);
      poVar6 = std::operator<<((ostream *)local_1a0,
                               (((this->m_sourceText).c.
                                 super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Deque_impl_data._M_start._M_cur)->_M_dataplus)._M_p
                              );
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\" is invalid timing info",0x18);
      puVar7 = (undefined4 *)__cxa_allocate_exception(0x28);
      std::__cxx11::stringbuf::str();
      *puVar7 = 3;
      *(undefined4 **)(puVar7 + 2) = puVar7 + 6;
      if (local_1c0 == &local_1b0) {
        puVar7[6] = local_1b0;
        puVar7[7] = uStack_1ac;
        puVar7[8] = uStack_1a8;
        puVar7[9] = uStack_1a4;
      }
      else {
        *(uint **)(puVar7 + 2) = local_1c0;
        *(ulong *)(puVar7 + 6) = CONCAT44(uStack_1ac,local_1b0);
      }
      *(undefined8 *)(puVar7 + 4) = local_1b8;
      local_1b0 = local_1b0 & 0xffffff00;
      __cxa_throw(puVar7,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
    }
    this->m_state = PARSE_TEXT;
    std::
    deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::pop_front(&this_00->c);
    this->m_processedSize =
         this->m_processedSize +
         *(this->m_origSize).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
          super__Deque_impl_data._M_start._M_cur;
    std::deque<int,_std::allocator<int>_>::pop_front(&(this->m_origSize).c);
    text = (this->m_sourceText).c.
           super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur;
    psVar4 = (this->m_sourceText).c.
             super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (psVar4 == text) {
      return (uint8_t *)0x0;
    }
  }
  if (psVar4 != text) {
    psVar4 = &this->m_renderedText;
    do {
      if (text->_M_string_length == 0) {
        std::
        deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::pop_front(&this_00->c);
        this->m_processedSize =
             this->m_processedSize +
             *(this->m_origSize).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
              super__Deque_impl_data._M_start._M_cur;
        std::deque<int,_std::allocator<int>_>::pop_front(&(this->m_origSize).c);
        puVar5 = text_subtitles::TextToPGSConverter::doConvert
                           (this->m_srtRender,psVar4,&this->m_animation,this->m_inTime,
                            this->m_outTime,renderedLen);
        this->m_state = PARSE_FIRST_LINE;
        (this->m_renderedText)._M_string_length = 0;
        *(this->m_renderedText)._M_dataplus._M_p = '\0';
        return puVar5;
      }
      if ((this->m_renderedText)._M_string_length != 0) {
        std::__cxx11::string::push_back((char)psVar4);
        text = (this->m_sourceText).c.
               super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Deque_impl_data._M_start._M_cur;
      }
      std::__cxx11::string::_M_append((char *)psVar4,(ulong)(text->_M_dataplus)._M_p);
      std::
      deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::pop_front(&this_00->c);
      this->m_processedSize =
           this->m_processedSize +
           *(this->m_origSize).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
            super__Deque_impl_data._M_start._M_cur;
      std::deque<int,_std::allocator<int>_>::pop_front(&(this->m_origSize).c);
      text = (this->m_sourceText).c.
             super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur;
    } while ((this->m_sourceText).c.
             super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur != text);
  }
  if ((this->m_lastBlock == true) && ((this->m_renderedText)._M_string_length != 0)) {
    this->m_state = PARSE_FIRST_LINE;
    (this->m_renderedText)._M_string_length = 0;
    *(this->m_renderedText)._M_dataplus._M_p = '\0';
    puVar5 = text_subtitles::TextToPGSConverter::doConvert
                       (this->m_srtRender,&this->m_renderedText,&this->m_animation,this->m_inTime,
                        this->m_outTime,renderedLen);
    return puVar5;
  }
  return (uint8_t *)0x0;
}

Assistant:

uint8_t* SRTStreamReader::renderNextMessage(uint32_t& renderedLen)
{
    uint8_t* rez = nullptr;
    if (m_sourceText.empty())
        return nullptr;
    if (m_state == ParseState::PARSE_FIRST_LINE)
    {
        while (!m_sourceText.empty() && m_sourceText.front().empty())
        {
            m_sourceText.pop();  // delete empty lines before message
            m_processedSize += m_origSize.front();
            m_origSize.pop();
        }
        if (m_sourceText.empty())
            return nullptr;
        m_state = ParseState::PARSE_TIME;
        bool isNUmber = true;
        {
            for (const auto& c : m_sourceText.front())
                if (!(c >= '0' && c <= '9') && c != ' ')
                {
                    isNUmber = false;
                    break;
                }
        }
        if (isNUmber)
        {
            m_sourceText.pop();
            m_processedSize += m_origSize.front();
            m_origSize.pop();
            if (m_sourceText.empty())
                return nullptr;
        }
    }
    if (m_state == ParseState::PARSE_TIME)
    {
        if (!parseTime(m_sourceText.front()))
            THROW(ERR_COMMON, "Invalid SRT format. \"" << m_sourceText.front().c_str() << "\" is invalid timing info")
        m_state = ParseState::PARSE_TEXT;
        m_sourceText.pop();
        m_processedSize += m_origSize.front();
        m_origSize.pop();
        if (m_sourceText.empty())
            return nullptr;
    }

    while (!m_sourceText.empty() && !m_sourceText.front().empty())
    {
        if (!m_renderedText.empty())
            m_renderedText += '\n';
        m_renderedText += m_sourceText.front();
        m_sourceText.pop();
        m_processedSize += m_origSize.front();
        m_origSize.pop();
    }

    if (m_sourceText.empty())
    {
        if (m_lastBlock && !m_renderedText.empty())
        {
            m_state = ParseState::PARSE_FIRST_LINE;
            m_renderedText.clear();
            rez = m_srtRender->doConvert(m_renderedText, m_animation, m_inTime, m_outTime, renderedLen);
        }
        return rez;
    }
    m_sourceText.pop();  // delete empty line (messages separator)
    m_processedSize += m_origSize.front();
    m_origSize.pop();
    rez = m_srtRender->doConvert(m_renderedText, m_animation, m_inTime, m_outTime, renderedLen);
    m_state = ParseState::PARSE_FIRST_LINE;
    m_renderedText.clear();
    return rez;
}